

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall gimage::Histogram::convertToImage(Histogram *this,ImageFloat *image)

{
  uint uVar1;
  int iVar2;
  unsigned_long **ppuVar3;
  float ***pppfVar4;
  unsigned_long *puVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar7 = (long)this->h;
  uVar1 = this->w;
  if (0 < lVar7) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar9 = 0;
        do {
          uVar10 = uVar10 + this->row[lVar8][uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7);
    Image<float,_gimage::PixelTraits<float>_>::setSize(image,(long)(int)uVar1,lVar7,1);
    if ((uVar10 != 0) && (iVar2 = this->h, 0 < (long)iVar2)) {
      uVar1 = this->w;
      ppuVar3 = this->row;
      pppfVar4 = image->img;
      lVar7 = 0;
      do {
        if (0 < (int)uVar1) {
          puVar5 = ppuVar3[lVar7];
          pfVar6 = (*pppfVar4)[lVar7];
          uVar9 = 0;
          do {
            pfVar6[uVar9] = (float)puVar5[uVar9] / (float)uVar10;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar2);
    }
    return;
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(image,(long)(int)uVar1,lVar7,1);
  return;
}

Assistant:

void Histogram::convertToImage(ImageFloat &image) const
{
  float total=static_cast<float>(sumAll());

  image.setSize(w, h, 1);

  if (total > 0)
  {
    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, row[k][i]/total);
      }
    }
  }
}